

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckLocalIndex(SharedValidator *this,Var *param_1,Type *out_type)

{
  bool bVar1;
  Index IVar2;
  char *pcVar3;
  pointer pLVar4;
  int __c;
  Var *__s;
  __normal_iterator<wabt::SharedValidator::LocalDecl_*,_std::vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>_>
  local_50;
  undefined4 local_44;
  LocalDecl *local_40;
  LocalDecl *local_38;
  __normal_iterator<wabt::SharedValidator::LocalDecl_*,_std::vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>_>
  local_30;
  __normal_iterator<wabt::SharedValidator::LocalDecl_*,_std::vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>_>
  iter;
  Type *out_type_local;
  Var *local_var_local;
  SharedValidator *this_local;
  
  __s = param_1;
  iter._M_current = (LocalDecl *)out_type;
  local_38 = (LocalDecl *)
             std::
             vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
             ::begin(&this->locals_);
  local_40 = (LocalDecl *)
             std::
             vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
             ::end(&this->locals_);
  pcVar3 = Var::index(param_1,(char *)__s,__c);
  local_44 = SUB84(pcVar3,0);
  local_30 = std::
             upper_bound<__gnu_cxx::__normal_iterator<wabt::SharedValidator::LocalDecl*,std::vector<wabt::SharedValidator::LocalDecl,std::allocator<wabt::SharedValidator::LocalDecl>>>,unsigned_int,wabt::SharedValidator::CheckLocalIndex(wabt::Var,wabt::Type*)::__0>
                       (local_38,local_40,&local_44);
  local_50._M_current =
       (LocalDecl *)
       std::
       vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>::
       end(&this->locals_);
  bVar1 = __gnu_cxx::operator==(&local_30,&local_50);
  if (bVar1) {
    IVar2 = GetLocalCount(this);
    this_local._4_4_ =
         PrintError(this,&param_1->loc,"local variable out of range (max %u)",(ulong)IVar2);
  }
  else {
    pLVar4 = __gnu_cxx::
             __normal_iterator<wabt::SharedValidator::LocalDecl_*,_std::vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>_>
             ::operator->(&local_30);
    (iter._M_current)->type = pLVar4->type;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::CheckLocalIndex(Var local_var, Type* out_type) {
  auto iter = std::upper_bound(
      locals_.begin(), locals_.end(), local_var.index(),
      [](Index index, const LocalDecl& decl) { return index < decl.end; });
  if (iter == locals_.end()) {
    // TODO: better error
    return PrintError(local_var.loc, "local variable out of range (max %u)",
                      GetLocalCount());
  }
  *out_type = iter->type;
  return Result::Ok;
}